

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestNoExplicitOutput::Run(ParserTestNoExplicitOutput *this)

{
  Test *this_00;
  bool condition;
  string err;
  ManifestParser parser;
  string local_b8;
  string local_98;
  ManifestParser local_78;
  
  ManifestParser::ManifestParser
            (&local_78,&(this->super_ParserTest).state,(FileReader *)0x0,(ManifestParserOptions)0x0)
  ;
  this_00 = g_current_test;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"rule cat\n  command = cat $in > $out\nbuild | imp : cat bar\n","")
  ;
  condition = ManifestParser::ParseTest(&local_78,&local_b8,&local_98);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x3fd,
             "parser.ParseTest( \"rule cat\\n\" \"  command = cat $in > $out\\n\" \"build | imp : cat bar\\n\", &err)"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(ParserTest, NoExplicitOutput) {
  ManifestParser parser(&state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest(
"rule cat\n"
"  command = cat $in > $out\n"
"build | imp : cat bar\n", &err));
}